

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numsys.cpp
# Opt level: O0

void __thiscall icu_63::NumberingSystem::NumberingSystem(NumberingSystem *this)

{
  ConstChar16Ptr local_68;
  undefined1 local_60 [8];
  UnicodeString defaultDigits;
  NumberingSystem *this_local;
  
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__NumberingSystem_004aa288;
  UnicodeString::UnicodeString(&this->desc);
  this->radix = 10;
  this->algorithmic = '\0';
  ConstChar16Ptr::ConstChar16Ptr(&local_68,L"0123456789");
  UnicodeString::UnicodeString((UnicodeString *)local_60,'\x01',&local_68,-1);
  ConstChar16Ptr::~ConstChar16Ptr(&local_68);
  UnicodeString::setTo(&this->desc,(UnicodeString *)local_60);
  strcpy(this->name,"latn");
  UnicodeString::~UnicodeString((UnicodeString *)local_60);
  return;
}

Assistant:

NumberingSystem::NumberingSystem() {
     radix = 10;
     algorithmic = FALSE;
     UnicodeString defaultDigits = DEFAULT_DIGITS;
     desc.setTo(defaultDigits);
     uprv_strcpy(name,gLatn);
}